

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compress2
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_bufferMode_e ZVar1;
  ZSTD_bufferMode_e ZVar2;
  size_t err_code;
  size_t sVar3;
  size_t sVar4;
  ZSTD_outBuffer output;
  ZSTD_outBuffer local_40;
  ZSTD_inBuffer local_28;
  
  cctx->streamStage = zcss_init;
  cctx->pledgedSrcSizePlusOne = 0;
  local_40.pos = 0;
  local_28.pos = 0;
  ZVar1 = (cctx->requestedParams).inBufferMode;
  ZVar2 = (cctx->requestedParams).outBufferMode;
  (cctx->requestedParams).inBufferMode = ZSTD_bm_stable;
  (cctx->requestedParams).outBufferMode = ZSTD_bm_stable;
  local_40.dst = dst;
  local_40.size = dstCapacity;
  local_28.src = src;
  local_28.size = srcSize;
  sVar3 = ZSTD_compressStream2(cctx,&local_40,&local_28,ZSTD_e_end);
  sVar4 = 0xffffffffffffffba;
  if (sVar3 == 0) {
    sVar4 = local_40.pos;
  }
  (cctx->requestedParams).inBufferMode = ZVar1;
  (cctx->requestedParams).outBufferMode = ZVar2;
  if (0xffffffffffffff88 < sVar3) {
    sVar4 = sVar3;
  }
  return sVar4;
}

Assistant:

size_t ZSTD_compress2(ZSTD_CCtx* cctx,
                      void* dst, size_t dstCapacity,
                      const void* src, size_t srcSize)
{
    ZSTD_bufferMode_e const originalInBufferMode = cctx->requestedParams.inBufferMode;
    ZSTD_bufferMode_e const originalOutBufferMode = cctx->requestedParams.outBufferMode;
    DEBUGLOG(4, "ZSTD_compress2 (srcSize=%u)", (unsigned)srcSize);
    ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
    /* Enable stable input/output buffers. */
    cctx->requestedParams.inBufferMode = ZSTD_bm_stable;
    cctx->requestedParams.outBufferMode = ZSTD_bm_stable;
    {   size_t oPos = 0;
        size_t iPos = 0;
        size_t const result = ZSTD_compressStream2_simpleArgs(cctx,
                                        dst, dstCapacity, &oPos,
                                        src, srcSize, &iPos,
                                        ZSTD_e_end);
        /* Reset to the original values. */
        cctx->requestedParams.inBufferMode = originalInBufferMode;
        cctx->requestedParams.outBufferMode = originalOutBufferMode;

        FORWARD_IF_ERROR(result, "ZSTD_compressStream2_simpleArgs failed");
        if (result != 0) {  /* compression not completed, due to lack of output space */
            assert(oPos == dstCapacity);
            RETURN_ERROR(dstSize_tooSmall, "");
        }
        assert(iPos == srcSize);   /* all input is expected consumed */
        return oPos;
    }
}